

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O2

void __thiscall ADynamicLight::PostBeginPlay(ADynamicLight *this)

{
  subsector_t *psVar1;
  DVector2 local_18;
  
  AActor::PostBeginPlay(&this->super_AActor);
  if (((this->super_AActor).SpawnFlags & 0x10) == 0) {
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0xd])(this,0);
  }
  local_18.X = (this->super_AActor).__Pos.X;
  local_18.Y = (this->super_AActor).__Pos.Y;
  psVar1 = R_PointInSubsector(&local_18);
  this->subsector = psVar1;
  return;
}

Assistant:

void ADynamicLight::PostBeginPlay()
{
	Super::PostBeginPlay();
	
	if (!(SpawnFlags & MTF_DORMANT))
	{
		Activate (NULL);
	}

	subsector = R_PointInSubsector(Pos());
}